

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void refreshLine(linenoiseState *l)

{
  char *pcVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint i;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int local_9c;
  abuf local_98;
  char *local_88;
  size_t local_80;
  char seq [64];
  
  if (mlmode == 0) {
    local_80 = strlen(l->prompt);
    local_9c = l->ofd;
    local_88 = l->buf;
    uVar2 = l->cols;
    uVar8 = l->pos + local_80;
    uVar12 = uVar2 - 1;
    if (uVar8 < uVar2 - 1) {
      uVar12 = uVar8;
    }
    uVar10 = (l->len - l->pos) + uVar12;
    if (uVar2 < uVar10) {
      uVar10 = uVar2;
    }
    local_98.b = (char *)0x0;
    local_98.len = 0;
    seq[0] = '\r';
    seq[1] = '\0';
    sVar6 = strlen(seq);
    abAppend(&local_98,seq,(int)sVar6);
    pcVar1 = l->prompt;
    sVar6 = strlen(pcVar1);
    abAppend(&local_98,pcVar1,(int)sVar6);
    iVar9 = (int)local_80;
    if (maskmode == '\x01') {
      for (lVar13 = local_80 - uVar10; lVar13 != 0; lVar13 = lVar13 + 1) {
        abAppend(&local_98,"*",1);
      }
    }
    else {
      abAppend(&local_98,local_88 + (uVar8 - uVar12),(int)uVar10 - iVar9);
    }
    refreshShowHints(&local_98,l,iVar9);
    seq._4_4_ = SUB84(seq._0_8_,4) & 0xffffff00;
    builtin_strncpy(seq,"\x1b[0K",4);
    sVar6 = strlen(seq);
    abAppend(&local_98,seq,(int)sVar6);
    snprintf(seq,0x40,"\r\x1b[%dC",uVar12 & 0xffffffff);
    sVar6 = strlen(seq);
    abAppend(&local_98,seq,(int)sVar6);
  }
  else {
    local_80 = strlen(l->prompt);
    lVar13 = (long)(int)local_80;
    uVar8 = l->cols;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (l->len + uVar8 + lVar13) - 1;
    local_88 = SUB168(auVar4 / auVar3,0);
    iVar9 = (int)l->maxrows;
    iVar11 = SUB164(auVar4 / auVar3,0);
    if (iVar9 < iVar11) {
      l->maxrows = (long)iVar11;
    }
    local_9c = l->ofd;
    local_98.b = (char *)0x0;
    local_98.len = 0;
    if ((int)((uVar8 + lVar13 + l->oldpos) / uVar8) < iVar9) {
      snprintf(seq,0x40,"\x1b[%dB");
      sVar6 = strlen(seq);
      abAppend(&local_98,seq,(int)sVar6);
    }
    iVar11 = 1;
    if (1 < iVar9) {
      iVar11 = iVar9;
    }
    while (iVar11 = iVar11 + -1, iVar11 != 0) {
      builtin_strncpy(seq,"\r\x1b[0K\x1b[1A",10);
      sVar6 = strlen(seq);
      abAppend(&local_98,seq,(int)sVar6);
    }
    builtin_strncpy(seq,"\r\x1b[0K",6);
    uVar5 = seq._0_4_;
    seq._0_8_ = CONCAT44(seq._4_4_,uVar5);
    sVar6 = strlen(seq);
    abAppend(&local_98,seq,(int)sVar6);
    pcVar1 = l->prompt;
    sVar6 = strlen(pcVar1);
    abAppend(&local_98,pcVar1,(int)sVar6);
    if (maskmode == '\x01') {
      for (uVar8 = 0; uVar8 < l->len; uVar8 = (ulong)((int)uVar8 + 1)) {
        abAppend(&local_98,"*",1);
      }
    }
    else {
      abAppend(&local_98,l->buf,(int)l->len);
    }
    iVar9 = (int)local_80;
    refreshShowHints(&local_98,l,iVar9);
    sVar7 = l->pos;
    if (((sVar7 == 0) || (sVar7 != l->len)) || ((sVar7 + lVar13) % l->cols != 0)) {
      iVar11 = (int)local_88;
    }
    else {
      abAppend(&local_98,"\n",1);
      seq[0] = '\r';
      seq[1] = '\0';
      sVar6 = strlen(seq);
      abAppend(&local_98,seq,(int)sVar6);
      iVar11 = (int)local_88 + 1;
      if ((int)l->maxrows <= (int)local_88) {
        l->maxrows = (long)iVar11;
      }
    }
    sVar7 = l->pos;
    uVar8 = l->cols;
    if ((int)((lVar13 + sVar7 + uVar8) / uVar8) < iVar11) {
      snprintf(seq,0x40,"\x1b[%dA");
      sVar6 = strlen(seq);
      abAppend(&local_98,seq,(int)sVar6);
      sVar7 = l->pos;
      uVar8 = l->cols;
    }
    uVar8 = (long)((int)sVar7 + iVar9) % (long)(int)uVar8;
    if ((int)uVar8 == 0) {
      seq[0] = '\r';
      seq[1] = '\0';
    }
    else {
      snprintf(seq,0x40,"\r\x1b[%dC",uVar8 & 0xffffffff);
    }
    sVar6 = strlen(seq);
    abAppend(&local_98,seq,(int)sVar6);
    l->oldpos = l->pos;
  }
  pcVar1 = local_98.b;
  write(local_9c,local_98.b,(long)local_98.len);
  free(pcVar1);
  return;
}

Assistant:

static void refreshLine(struct linenoiseState *l) {
    if (mlmode)
        refreshMultiLine(l);
    else
        refreshSingleLine(l);
}